

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void fill_suite::back_inserter_fill_n_full(void)

{
  initializer_list<int> __l;
  size_type sVar1;
  iterator second_begin;
  iterator second_end;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_a1;
  int local_a0 [4];
  iterator local_90;
  size_type local_88;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> expect;
  size_type local_60 [2];
  circular_view<int,_18446744073709551615UL> *local_50;
  int local_44;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_40 = std::back_inserter<vista::circular_view<int,18446744073709551615ul>>
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::capacity
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_44 = 0x37;
  local_50 = (circular_view<int,_18446744073709551615UL> *)
             std::
             fill_n<std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,unsigned_long,int>
                       (local_40,sVar1 * 2,&local_44);
  local_60[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)vista::circular_view<int,_18446744073709551615UL>::capacity
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("span.size()","span.capacity()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x113,"void fill_suite::back_inserter_fill_n_full()",local_60,
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_a0[0] = 0x37;
  local_a0[1] = 0x37;
  local_a0[2] = 0x37;
  local_a0[3] = 0x37;
  local_90 = local_a0;
  local_88 = 4;
  std::allocator<int>::allocator(&local_a1);
  __l._M_len = local_88;
  __l._M_array = local_90;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,__l,&local_a1);
  std::allocator<int>::~allocator(&local_a1);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_80);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_80);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x117,"void fill_suite::back_inserter_fill_n_full()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  return;
}

Assistant:

void back_inserter_fill_n_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::fill_n(std::back_inserter(span), 2 * span.capacity(), 55);
    BOOST_TEST_EQ(span.size(), span.capacity());
    {
        std::vector<int> expect = { 55, 55, 55, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}